

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToHalfPass::GenHalfInst(ConvertToHalfPass *this,Instruction *inst)

{
  bool bVar1;
  bool bVar2;
  uint32_t id;
  size_type sVar3;
  Op local_1c;
  
  id = Instruction::result_id(inst);
  bVar1 = IsRelaxed(this,id);
  bVar2 = IsArithmetic(this,inst);
  if ((bVar1) && (bVar2)) {
    bVar1 = GenHalfArith(this,inst);
    return bVar1;
  }
  local_1c = inst->opcode_;
  if (bVar1 && local_1c == OpPhi) {
    bVar1 = ProcessPhi(this,inst,0x20,0x10);
    return bVar1;
  }
  if (local_1c == OpFConvert) {
    ProcessConvert(this,inst);
    bVar1 = true;
  }
  else {
    sVar3 = std::
            _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->image_ops_)._M_h,&local_1c);
    if (sVar3 == 0) {
      bVar1 = ProcessDefault(this,inst);
    }
    else {
      bVar1 = ProcessImageRef(this,inst);
    }
  }
  return bVar1;
}

Assistant:

bool ConvertToHalfPass::GenHalfInst(Instruction* inst) {
  bool modified = false;
  // Remember id for later deletion of RelaxedPrecision decoration
  bool inst_relaxed = IsRelaxed(inst->result_id());
  if (IsArithmetic(inst) && inst_relaxed)
    modified = GenHalfArith(inst);
  else if (inst->opcode() == spv::Op::OpPhi && inst_relaxed)
    modified = ProcessPhi(inst, 32u, 16u);
  else if (inst->opcode() == spv::Op::OpFConvert)
    modified = ProcessConvert(inst);
  else if (image_ops_.count(inst->opcode()) != 0)
    modified = ProcessImageRef(inst);
  else
    modified = ProcessDefault(inst);
  return modified;
}